

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::PlyParser::PlyParser(PlyParser *this,FileName *fileName)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  mapped_type *elt;
  runtime_error *prVar6;
  pointer __k;
  string line;
  string signature;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  header;
  
  std::fstream::fstream(this);
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mesh).elements._M_t._M_impl.super__Rb_tree_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scene).ptr = (Node *)0x0;
  this->format = ASCII;
  std::fstream::open((char *)this,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&line,(string *)fileName);
    std::operator+(&signature,"cannot open file : ",&line);
    std::runtime_error::runtime_error(prVar6,(string *)&signature);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)this,(string *)&signature);
  bVar4 = std::operator!=(&signature,"ply");
  if (!bVar4) {
    header.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&header;
    header.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    header.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         header.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while( true ) {
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)&line.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)&line);
      bVar4 = std::operator==(&line,"end_header");
      if (bVar4) break;
      lVar5 = std::__cxx11::string::find((char)&line,0x23);
      if (lVar5 != 0) {
        bVar4 = std::operator==(&line,"");
        if (!bVar4) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&header,&line);
        }
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::__cxx11::string::~string((string *)&line);
    parseHeader(this,&header);
    for (__k = (this->mesh).order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != (this->mesh).order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      elt = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
            ::operator[](&(this->mesh).elements,__k);
      parseElementData(this,elt);
    }
    import((PlyParser *)&line);
    pNVar2 = (this->scene).ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
    (this->scene).ptr = (Node *)line._M_dataplus._M_p;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&header.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::__cxx11::string::~string((string *)&signature);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&line,"invalid PLY file signature: ",&signature);
  std::runtime_error::runtime_error(prVar6,(string *)&line);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PlyParser(const FileName& fileName) : format(ASCII)
      {
        /* open file */
        fs.open (fileName.c_str(), std::fstream::in | std::fstream::binary);
        if (!fs.is_open()) throw std::runtime_error("cannot open file : " + fileName.str());

        /* check for file signature */
        std::string signature; getline(fs,signature);
        if (signature != "ply") throw std::runtime_error("invalid PLY file signature: " + signature);
        
        /* read header */
        std::list<std::string> header;
        while (true) {
          std::string line; getline(fs,line);
          if (line == "end_header") break;
          if (line.find_first_of('#') == 0) continue;
          if (line == "") continue;
          header.push_back(line);
        }

        /* parse header */
        parseHeader(header);

        /* now parse all elements */
        for (std::vector<std::string>::iterator i = mesh.order.begin(); i!=mesh.order.end(); i++)
          parseElementData(mesh.elements[*i]);

        /* create triangle mesh */
        scene = import();
      }